

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O1

blob_t blobResize(blob_t blob,size_t size)

{
  ulong uVar1;
  ulong count;
  blob_t pvVar2;
  size_t *psVar3;
  ulong count_00;
  
  if (blob == (blob_t)0x0) {
    pvVar2 = blobCreate(size);
    return pvVar2;
  }
  uVar1 = *(ulong *)((long)blob + -8);
  psVar3 = (size_t *)((long)blob + -8);
  count_00 = uVar1 + 0x407 & 0xfffffffffffffc00;
  if (size == 0) {
    memWipe(psVar3,count_00);
    memFree(psVar3);
LAB_0011825a:
    psVar3 = (size_t *)0x0;
  }
  else {
    count = size + 0x407 & 0xfffffffffffffc00;
    if (count_00 != count) {
      psVar3 = (size_t *)memRealloc(psVar3,count);
      if (psVar3 == (size_t *)0x0) goto LAB_0011825a;
    }
    *psVar3 = size;
    psVar3 = psVar3 + 1;
    if (uVar1 <= size && size - uVar1 != 0) {
      memSet((void *)(uVar1 + (long)psVar3),'\0',size - uVar1);
    }
  }
  return psVar3;
}

Assistant:

blob_t blobResize(blob_t blob, size_t size)
{
	size_t old_size;
	size_t* ptr;
	// pre
	ASSERT(blobIsValid(blob));
	// создать блоб
	if (blob == 0)
		return blobCreate(size);
	// освободить блоб
	if (size == 0)
	{
		blobClose(blob);
		return 0;
	}
	// сохранить размер
	old_size = blobSizeOf(blob);
	// перераспределить память?
	ptr = blobPtrOf(blob);
	if (blobActualSizeOf(blob) != blobActualSize(size))
	{
		ptr = (size_t*)memRealloc(ptr, blobActualSize(size));
		if (ptr == 0)
			return 0;
	}
	// настроить и возвратить блоб
	*ptr = size;
	blob = blobValueOf(ptr);
	if (size > old_size)
		memSetZero((octet*)blob + old_size, size - old_size);
	return blob;
}